

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

Pseudo * linearize_symbol_expression(Proc *proc,AstNode *expr)

{
  AstNodeType AVar1;
  SymbolType SVar2;
  uint uVar3;
  AstNode *pAVar4;
  C_MemoryAllocator *pCVar5;
  CompilerState *pCVar6;
  undefined1 *puVar7;
  StringObject *pSVar8;
  LuaSymbol *pLVar9;
  LuaSymbol *pLVar10;
  LuaSymbolList *pLVar11;
  Pseudo *pPVar12;
  Constant local_40;
  
  pAVar4 = (expr->field_2).function_stmt.function_expr;
  AVar1 = pAVar4->type;
  if (AVar1 == AST_NONE) {
    pLVar11 = (pAVar4->field_2).function_expr.args;
  }
  else {
    if (AVar1 == STMT_RETURN) {
      pCVar5 = proc->linearizer->compiler_state->allocator;
      pPVar12 = allocate_symbol_pseudo
                          ((Proc *)pCVar5->arena,(LuaSymbol *)pCVar5->calloc,(uint)pAVar4);
      return pPVar12;
    }
    if (AVar1 != STMT_GOTO) {
      pCVar6 = proc->linearizer->compiler_state;
      raviX_buffer_add_string(&pCVar6->error_message,"feature not yet implemented");
      longjmp((__jmp_buf_tag *)pCVar6->env,1);
    }
    if ((pAVar4->field_2).for_stmt.for_statement_list == (AstNodeList *)0x0) {
      __assert_fail("sym->variable.env",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x4f8,"Pseudo *linearize_symbol_expression(Proc *, AstNode *)");
    }
    local_40.field_2 =
         (anon_union_8_3_4e90b7ae_for_Constant_2)(pAVar4->field_2).goto_stmt.goto_scope;
    local_40.type = 0x101;
    local_40.index = 0;
    pSVar8 = (StringObject *)add_constant(proc,&local_40);
    pCVar5 = proc->linearizer->compiler_state->allocator;
    pLVar9 = (LuaSymbol *)(*pCVar5->calloc)(pCVar5->arena,1,0x30);
    SVar2 = pLVar9->symbol_type;
    pLVar9->symbol_type = SVar2 & 0xfffffff0 | (SYM_ENV|SYM_UPVALUE);
    (pLVar9->field_1).label.label_name = pSVar8;
    pLVar9->symbol_type =
         SVar2 & 0xfff00000 | (SYM_ENV|SYM_UPVALUE) |
         (uint)*(uint16_t *)((long)&pSVar8->len + 2) << 4;
    pCVar5 = proc->linearizer->compiler_state->allocator;
    pLVar10 = (LuaSymbol *)
              allocate_symbol_pseudo
                        ((Proc *)pCVar5->arena,(LuaSymbol *)pCVar5->calloc,
                         (uint)*(undefined8 *)((long)&pAVar4->field_2 + 0x20));
    if ((pLVar10->symbol_type & 0xf) == 0xe) {
      __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x4d1,
                    "Pseudo *create_global_indexed_pseudo(Proc *, Pseudo *, Pseudo *, unsigned int)"
                   );
    }
    if ((pLVar9->symbol_type & 0xf) == 0xe) {
      __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x4d2,
                    "Pseudo *create_global_indexed_pseudo(Proc *, Pseudo *, Pseudo *, unsigned int)"
                   );
    }
    uVar3 = expr->line_number;
    pCVar5 = proc->linearizer->compiler_state->allocator;
    pLVar11 = (LuaSymbolList *)(*pCVar5->calloc)(pCVar5->arena,1,0x30);
    *(uint *)pLVar11 = *(uint *)pLVar11 & 0xfffffff0 | 0xe;
    *(uint *)&pLVar11->allocator_ = uVar3;
    ((anon_union_40_9_1ec7a544_for_Pseudo_3 *)&pLVar11->prev_)->symbol = (LuaSymbol *)0x101ffffffff;
    pLVar11->list_[0] = pLVar10;
    pLVar11->list_[1] = pLVar9;
    *(undefined4 *)&pLVar11->next_ = 0xffffffff;
    puVar7 = (undefined1 *)((long)&pLVar11->next_ + 4);
    *puVar7 = *puVar7 | 1;
  }
  return (Pseudo *)pLVar11;
}

Assistant:

static Pseudo *linearize_symbol_expression(Proc *proc, AstNode *expr)
{
	LuaSymbol *sym = expr->symbol_expr.var;
	if (sym->symbol_type == SYM_GLOBAL) {
		assert(sym->variable.env);
		const Constant *constant = allocate_string_constant(proc, sym->variable.var_name);
		Pseudo *operand_varname = allocate_constant_pseudo(proc, constant);
		Pseudo* operand_env = allocate_symbol_pseudo(proc, sym->variable.env, 0); // no register
		return create_global_indexed_pseudo(proc, operand_env, operand_varname, expr->line_number);
	} else if (sym->symbol_type == SYM_LOCAL) {
		return sym->variable.pseudo;
	} else if (sym->symbol_type == SYM_UPVALUE) {
		/* upvalue index is the position of upvalue in the function, we treat this as the pseudo register for
		 * the upvalue */
		return allocate_symbol_pseudo(proc, sym, sym->upvalue.upvalue_index);
	} else {
		handle_error(proc->linearizer->compiler_state, "feature not yet implemented");
		return NULL;
	}
}